

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  string *psVar2;
  bool local_8b;
  bool local_89;
  cmValue local_70;
  cmValue linkerId;
  undefined1 local_58 [8];
  string linkerIdVar;
  string ll;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  psVar2 = (string *)((long)&linkerIdVar.field_2 + 8);
  GetLinkerLanguage(psVar2,this,config);
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[20]>
            ((string *)local_58,(char (*) [7])0x104930a,psVar2,(char (*) [20])"_COMPILER_LINKER_ID")
  ;
  local_70 = cmMakefile::GetDefinition(this->Makefile,(string *)local_58);
  bVar1 = cmValue::operator_cast_to_bool(&local_70);
  local_89 = false;
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_70);
    bVar1 = std::operator==(psVar2,"GNU");
    local_8b = true;
    if (!bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_70);
      local_8b = std::operator==(psVar2,"Solaris");
    }
    local_89 = local_8b;
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(linkerIdVar.field_2._M_local_buf + 8));
  return local_89;
}

Assistant:

bool cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(
  std::string const& config) const
{
  // FIXME(#25486): Account for the LINKER_TYPE target property.
  // Also factor out the hard-coded list below into a platform
  // information table based on the linker id.
  std::string ll = this->GetLinkerLanguage(config);
  std::string linkerIdVar = cmStrCat("CMAKE_", ll, "_COMPILER_LINKER_ID");
  cmValue linkerId = this->Makefile->GetDefinition(linkerIdVar);
  // The GNU bfd-based linker may enforce '--no-allow-shlib-undefined'
  // recursively by default.  The Solaris linker has similar behavior.
  return linkerId && (*linkerId == "GNU" || *linkerId == "Solaris");
}